

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_stats.cpp
# Opt level: O0

int __thiscall libtorrent::find_metric_idx(libtorrent *this,string_view name)

{
  anon_class_16_1_898f2789_for__M_pred __pred;
  const_iterator pvVar1;
  const_iterator __last;
  stats_metric_impl *psVar2;
  stats_metric_impl *i;
  string_view name_local;
  
  pvVar1 = ::std::
           begin<libtorrent::aux::container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,long,std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,291ul>>>
                     ((container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
                       *)(anonymous_namespace)::metrics);
  __last = ::std::
           end<libtorrent::aux::container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,long,std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,291ul>>>
                     ((container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
                       *)(anonymous_namespace)::metrics);
  __pred.name._M_str = (char *)name._M_len;
  __pred.name._M_len = (size_t)this;
  psVar2 = ::std::
           find_if<libtorrent::(anonymous_namespace)::stats_metric_impl_const*,libtorrent::find_metric_idx(std::basic_string_view<char,std::char_traits<char>>)::__0>
                     (pvVar1,__last,__pred);
  pvVar1 = ::std::
           end<libtorrent::aux::container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,long,std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,291ul>>>
                     ((container_wrapper<libtorrent::(anonymous_namespace)::stats_metric_impl,_long,_std::array<libtorrent::(anonymous_namespace)::stats_metric_impl,_291UL>_>
                       *)(anonymous_namespace)::metrics);
  if (psVar2 == pvVar1) {
    name_local._M_str._4_4_ = -1;
  }
  else {
    name_local._M_str._4_4_ = psVar2->value_index;
  }
  return name_local._M_str._4_4_;
}

Assistant:

int find_metric_idx(string_view name)
	{
		auto const i = std::find_if(std::begin(metrics), std::end(metrics)
			, [name](stats_metric_impl const& metr)
			{ return metr.name == name; });

		if (i == std::end(metrics)) return -1;
		return i->value_index;
	}